

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O0

void Wln_RetFindSources_rec(Wln_Ret_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  bool bVar5;
  int *piStack_28;
  int FaninDelay;
  int *pLink;
  int local_18;
  int iFanin;
  int k;
  int iObj_local;
  Wln_Ret_t *p_local;
  
  iVar1 = Wln_ObjIsCi(p->pNtk,iObj);
  if ((iVar1 == 0) && (iVar1 = Wln_ObjCheckTravId(p->pNtk,iObj), iVar1 == 0)) {
    iVar1 = Vec_IntEntry(&p->vPathDelays,iObj);
    iVar2 = Vec_IntEntry(&p->vNodeDelays,iObj);
    local_18 = 0;
    while( true ) {
      iVar3 = Wln_ObjFaninNum(p->pNtk,iObj);
      bVar5 = false;
      if (local_18 < iVar3) {
        piVar4 = Wln_RetFanins(p,iObj);
        pLink._4_4_ = piVar4[local_18 << 1];
        piVar4 = Wln_RetFanins(p,iObj);
        piStack_28 = piVar4 + (long)(local_18 << 1) + 1;
        bVar5 = piStack_28 != (int *)0x0;
      }
      if (!bVar5) break;
      if (((pLink._4_4_ != 0) &&
          (((iVar3 = Wln_ObjFaninNum(p->pNtk,pLink._4_4_), iVar3 != 0 ||
            (iVar3 = Wln_ObjIsCi(p->pNtk,pLink._4_4_), iVar3 != 0)) && (*piStack_28 == 0)))) &&
         (iVar3 = Vec_IntEntry(&p->vPathDelays,pLink._4_4_), iVar3 == iVar1 - iVar2)) {
        Wln_RetFindSources_rec(p,pLink._4_4_);
      }
      local_18 = local_18 + 1;
    }
    if (iVar1 == iVar2) {
      Vec_IntPush(&p->vSources,iObj);
    }
  }
  return;
}

Assistant:

void Wln_RetFindSources_rec( Wln_Ret_t * p, int iObj )
{
    int k, iFanin, * pLink, FaninDelay;
    if ( Wln_ObjIsCi(p->pNtk, iObj) || Wln_ObjCheckTravId(p->pNtk, iObj) )
        return;
    FaninDelay = Vec_IntEntry( &p->vPathDelays, iObj ) - Vec_IntEntry( &p->vNodeDelays, iObj );
    Wln_RetForEachFanin( p, iObj, iFanin, pLink, k )
        if ( !pLink[0] && Vec_IntEntry(&p->vPathDelays, iFanin) == FaninDelay )
            Wln_RetFindSources_rec( p, iFanin );
    if ( FaninDelay == 0 )
        Vec_IntPush( &p->vSources, iObj );
}